

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.c
# Opt level: O1

void logevent(LogContext *ctx,char *event)

{
  char *pcVar1;
  char *event_00;
  char *pcVar2;
  char cVar3;
  
  if (ctx == (LogContext *)0x0) {
    return;
  }
  pcVar1 = strchr(event,10);
  if (pcVar1 == (char *)0x0) {
    pcVar1 = strchr(event,0xd);
    if (pcVar1 == (char *)0x0) {
      logevent_internal(ctx,event);
      return;
    }
  }
  event_00 = dupstr(event);
  pcVar1 = event_00;
  pcVar2 = event_00;
  do {
    cVar3 = *pcVar2;
    if ((cVar3 == '\n') || (cVar3 == '\r')) {
      do {
        do {
          pcVar2 = pcVar2 + 1;
        } while (*pcVar2 == '\r');
      } while (*pcVar2 == '\n');
      cVar3 = ' ';
    }
    else {
      if (cVar3 == '\0') {
        *pcVar1 = '\0';
        logevent_internal(ctx,event_00);
        safefree(event_00);
        return;
      }
      pcVar2 = pcVar2 + 1;
    }
    *pcVar1 = cVar3;
    pcVar1 = pcVar1 + 1;
  } while( true );
}

Assistant:

void logevent(LogContext *ctx, const char *event)
{
    if (!ctx)
        return;

    /*
     * Replace newlines in Event Log messages with spaces. (Sometimes
     * the same message string is reused for the Event Log and a GUI
     * dialog box; newlines are sometimes appropriate in the latter,
     * but never in the former.)
     */
    if (strchr(event, '\n') || strchr(event, '\r')) {
        char *dup = dupstr(event);
        char *p = dup, *q = dup;
        while (*p) {
            if (*p == '\r' || *p == '\n') {
                do {
                    p++;
                } while (*p == '\r' || *p == '\n');
                *q++ = ' ';
            } else {
                *q++ = *p++;
            }
        }
        *q = '\0';
        logevent_internal(ctx, dup);
        sfree(dup);
    } else {
        logevent_internal(ctx, event);
    }
}